

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionEuler::ComputeInertiaDampingMatrix
          (ChBeamSectionEuler *this,ChMatrixNM<double,_6,_6> *Ri,ChVector<double> *mW)

{
  undefined1 auVar1 [16];
  double local_170;
  ChMatrixNM<double,_6,_6> *local_168;
  ChVector<double> *local_160;
  ChVector<double> v;
  ChVector<double> mT;
  Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false> local_100;
  ChVector<double> mF;
  Matrix<double,_6,_1,_0,_6,_1> *local_b0;
  ChVectorN<double,_6> *local_a8;
  ChVectorN<double,_6> Fi0;
  ChVectorN<double,_6> Fi_dw;
  
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)Ri);
  if (this->compute_inertia_damping_matrix != false) {
    mF.m_data[0] = 0.0;
    mF.m_data[1] = 0.0;
    mF.m_data[2] = 0.0;
    mT.m_data[0] = 0.0;
    mT.m_data[1] = 0.0;
    mT.m_data[2] = 0.0;
    (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x10])(this,&mF,&mT,mW);
    local_168 = Ri;
    local_100.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         mF.m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&v,&Fi0,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_100);
    local_100.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         mT.m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&v,&Fi0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_100);
    v.m_data[0] = mW->m_data[0] + 1e-08;
    v.m_data[1] = mW->m_data[1] + 0.0;
    v.m_data[2] = mW->m_data[2] + 0.0;
    local_160 = mW;
    (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x10])(this,&mF,&mT,&v);
    local_100.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         mF.m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&v,&Fi_dw,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_100);
    local_100.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         mT.m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&v,&Fi_dw,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_100);
    local_a8 = &Fi0;
    local_170 = 100000000.0;
    local_b0 = &Fi_dw;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)&v,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                       *)&local_b0,&local_170);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
              (&local_100,local_168,0,3,6,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
              (&local_100,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)&v);
    auVar1 = vunpcklpd_avx(ZEXT816(0) << 0x40,ZEXT816(0x3e45798ee2308c3a));
    v.m_data[0] = auVar1._0_8_ + local_160->m_data[0];
    v.m_data[1] = auVar1._8_8_ + local_160->m_data[1];
    v.m_data[2] = local_160->m_data[2] + 0.0;
    (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x10])(this,&mF,&mT,&v);
    local_100.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         mF.m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&v,&Fi_dw,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_100);
    local_100.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         mT.m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&v,&Fi_dw,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_100);
    local_a8 = &Fi0;
    local_170 = 100000000.0;
    local_b0 = &Fi_dw;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)&v,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                       *)&local_b0,&local_170);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
              (&local_100,local_168,0,4,6,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
              (&local_100,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)&v);
    v.m_data[0] = local_160->m_data[0] + 0.0;
    v.m_data[1] = local_160->m_data[1] + 0.0;
    v.m_data[2] = local_160->m_data[2] + 1e-08;
    (*(this->super_ChBeamSection)._vptr_ChBeamSection[0x10])(this,&mF,&mT,&v);
    local_100.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         mF.m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&v,&Fi_dw,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_100);
    local_100.super_BlockImpl<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,__1,__1,_false>,_0>.m_data =
         mT.m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)&v,&Fi_dw,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false> *)&v,
               (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_100);
    local_a8 = &Fi0;
    local_170 = 100000000.0;
    local_b0 = &Fi_dw;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
    ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 *)&v,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                       *)&local_b0,&local_170);
    Eigen::Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_-1,_-1,_false>::Block
              (&local_100,local_168,0,5,6,1);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>>
              (&local_100,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)&v);
  }
  return;
}

Assistant:

void ChBeamSectionEuler::ComputeInertiaDampingMatrix(ChMatrixNM<double, 6, 6>& Ri,  ///< 6x6 sectional inertial-damping (gyroscopic damping) matrix values here
    const ChVector<>& mW    ///< current angular velocity of section, in material frame
	) {
		double Delta = 1e-8; // magic number, todo: parametrize or #define
		Ri.setZero();

		if (compute_inertia_damping_matrix == false) 
			return;

		// Fi=Fia+Fiv, where Fia depends on acceleration only, so restrict to Fiv quadratic terms for numerical differentiation.
		// Also we assume first three columns of Ri are null because Fiv does not depend on linear velocity.
		// Quadratic terms (gyro, centrifugal) at current state:
		ChVectorN<double,6> Fi0;
		ChVector<> mF, mT;
		this->ComputeQuadraticTerms(mF, mT, mW);  
		Fi0.segment(0, 3) = mF.eigen();
		Fi0.segment(3, 3) = mT.eigen();
		// dw_x 
		ChVectorN<double,6> Fi_dw;
		this->ComputeQuadraticTerms(mF, mT, mW + ChVector<>(Delta,0,0)); 
		Fi_dw.segment(0, 3) = mF.eigen();
		Fi_dw.segment(3, 3) = mT.eigen();
		Ri.block(0,3, 6,1) = (Fi_dw - Fi0) * (1.0 / Delta);
		// dw_y 
		this->ComputeQuadraticTerms(mF, mT, mW + ChVector<>(0,Delta,0)); 
		Fi_dw.segment(0, 3) = mF.eigen();
		Fi_dw.segment(3, 3) = mT.eigen();
		Ri.block(0,4, 6,1) = (Fi_dw - Fi0) * (1.0 / Delta);
		// dw_z 
		this->ComputeQuadraticTerms(mF, mT, mW + ChVector<>(0,0,Delta)); 
		Fi_dw.segment(0, 3) = mF.eigen();
		Fi_dw.segment(3, 3) = mT.eigen();
		Ri.block(0,5, 6,1) = (Fi_dw - Fi0) * (1.0 / Delta);
	}